

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckBox.cpp
# Opt level: O1

void __thiscall
gui::CheckBox::CheckBox(CheckBox *this,shared_ptr<gui::CheckBoxStyle> *style,String *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<gui::ButtonStyle> local_28;
  
  local_28.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Button::Button(&this->super_Button,&local_28,name);
  if (local_28.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  (this->super_Button).super_Widget.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__CheckBox_001e6ef8;
  (this->style_).super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (style->super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (style->super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->style_).super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->styleCopied_ = false;
  this->isChecked_ = false;
  return;
}

Assistant:

CheckBox::CheckBox(std::shared_ptr<CheckBoxStyle> style, const sf::String& name) :
    baseClass(nullptr, name),
    style_(style),
    styleCopied_(false),
    isChecked_(false) {
}